

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hl.c
# Opt level: O2

ErrorNumber test_func_per_hl(TA_History *history)

{
  int optInTimePeriod;
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  TA_Test_conflict8 *pTVar4;
  TA_Integer TVar5;
  TA_Integer TVar6;
  TA_Integer TVar7;
  TA_Real *pTVar8;
  TA_Real *pTVar9;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict8 *local_48;
  TA_Real *local_40;
  TA_Real *pTStack_38;
  
  uVar3 = 0;
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar4 = tableTest;
  do {
    if (uVar3 == 0x42) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < pTVar4->expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar4->theFunction) {
    case TA_ANY_MA_TEST:
      TVar6 = pTVar4->startIdx;
      TVar5 = pTVar4->endIdx;
      TVar7 = pTVar4->optInTimePeriod;
      pTVar8 = gBuffer[1].out0;
      pTVar9 = gBuffer[0].out0;
      goto LAB_0011853e;
    case TA_AD_TEST:
      TVar6 = pTVar4->startIdx;
      TVar5 = pTVar4->endIdx;
      TVar7 = pTVar4->optInTimePeriod;
      pTVar8 = gBuffer[0].out0;
      pTVar9 = gBuffer[1].out0;
LAB_0011853e:
      TVar1 = TA_AROON(TVar6,TVar5,gBuffer[0].in,gBuffer[1].in,TVar7,&outBegIdx,&outNbElement,pTVar8
                       ,pTVar9);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar1 = TA_AROONOSC(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                          pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ADOSC_5_2_TEST:
      TVar1 = TA_CORREL(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                        pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ACCBANDS_TEST:
      TVar1 = TA_BETA(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                      pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    default:
      TVar1 = 0x140d;
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if ((EVar2 != TA_TEST_PASS) ||
       (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 != TA_TEST_PASS))
    goto LAB_001188a8;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar4->expectedRetCode,outBegIdx,
                               pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) goto LAB_00118895;
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar4->theFunction) {
    case TA_ANY_MA_TEST:
      TVar6 = pTVar4->startIdx;
      TVar5 = pTVar4->endIdx;
      TVar7 = pTVar4->optInTimePeriod;
      pTVar8 = gBuffer[1].out1;
      pTVar9 = gBuffer[0].in;
      goto LAB_00118699;
    case TA_AD_TEST:
      TVar6 = pTVar4->startIdx;
      TVar5 = pTVar4->endIdx;
      TVar7 = pTVar4->optInTimePeriod;
      pTVar8 = gBuffer[0].in;
      pTVar9 = gBuffer[1].out1;
LAB_00118699:
      TVar1 = TA_AROON(TVar6,TVar5,gBuffer[0].in,gBuffer[1].in,TVar7,&outBegIdx,&outNbElement,pTVar8
                       ,pTVar9);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar1 = TA_AROONOSC(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                          pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_5_2_TEST:
      TVar1 = TA_CORREL(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                        pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ACCBANDS_TEST:
      TVar1 = TA_BETA(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                      pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    default:
      TVar1 = 0x140e;
    }
    EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[0].in), EVar2 != TA_TEST_PASS)) ||
       (EVar2 = checkSameContent(gBuffer[1].out1,gBuffer[1].out0), EVar2 != TA_TEST_PASS))
    goto LAB_001188a8;
    EVar2 = checkExpectedValue(gBuffer[0].in,TVar1,pTVar4->expectedRetCode,outBegIdx,
                               pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) {
LAB_00118895:
      printf("Fail for output id=%d\n",0);
      goto LAB_001188a8;
    }
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar4->theFunction) {
    case TA_ANY_MA_TEST:
      TVar6 = pTVar4->startIdx;
      TVar5 = pTVar4->endIdx;
      optInTimePeriod = pTVar4->optInTimePeriod;
      pTVar8 = gBuffer[1].out2;
      pTVar9 = gBuffer[1].in;
      goto LAB_0011881e;
    case TA_AD_TEST:
      TVar6 = pTVar4->startIdx;
      TVar5 = pTVar4->endIdx;
      optInTimePeriod = pTVar4->optInTimePeriod;
      pTVar8 = gBuffer[1].in;
      pTVar9 = gBuffer[1].out2;
LAB_0011881e:
      TA_AROON(TVar6,TVar5,gBuffer[0].in,gBuffer[1].in,optInTimePeriod,&outBegIdx,&outNbElement,
               pTVar8,pTVar9);
      break;
    case TA_ADOSC_3_10_TEST:
      TA_AROONOSC(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,
                  pTVar4->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ADOSC_5_2_TEST:
      TA_CORREL(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,pTVar4->optInTimePeriod,
                &outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ACCBANDS_TEST:
      TA_BETA(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,gBuffer[1].in,pTVar4->optInTimePeriod,
              &outBegIdx,&outNbElement,gBuffer[1].in);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if ((EVar2 != TA_TEST_PASS) ||
       (EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in), EVar2 != TA_TEST_PASS)) {
LAB_001188a8:
      printf("Failed Test #%d (Code=%d)\n",uVar3 & 0xffffffff,(ulong)EVar2);
      return EVar2;
    }
    local_40 = history->high;
    pTStack_38 = history->low;
    local_48 = pTVar4;
    if ((pTVar4->doRangeTestFlag != 0) &&
       (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_NONE,&local_48,1,0),
       EVar2 != TA_TEST_PASS)) goto LAB_001188a8;
    uVar3 = uVar3 + 1;
    pTVar4 = pTVar4 + 1;
  } while( true );
}

Assistant:

ErrorNumber test_func_per_hl( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}